

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test::TestBody
          (Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  AssertionResult local_228 [2];
  AssertHelper local_208 [8];
  Message local_200 [15];
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1c0 [8];
  Message local_1b8 [15];
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  undefined1 local_148 [8];
  VariablePtr v2;
  string local_130 [32];
  undefined1 local_110 [8];
  VariablePtr v1;
  string local_f8 [32];
  undefined1 local_d8 [8];
  UnitsPtr u1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ComponentPtr c1;
  string local_88 [32];
  undefined1 local_68 [8];
  ModelPtr m2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr m1;
  Units_linkingToUnitsInAnotherModelReturnsUnlinked_Test *this_local;
  
  m1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"m1",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"m2",
             (allocator<char> *)
             ((long)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Model::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"c1",
             (allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  libcellml::Component::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"u1",
             (allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"v1",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create((string *)local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"v2",&local_169);
  libcellml::Variable::create((string *)local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  libcellml::Variable::setUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"second",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::setUnits((string *)peVar5);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  libcellml::Model::addUnits((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  bVar1 = libcellml::Model::linkUnits();
  local_1a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar2) {
    testing::Message::Message(local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_1a8,"m1->linkUnits()","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x273,pcVar6);
    testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  bVar1 = libcellml::Model::hasUnlinkedUnits();
  local_1f1 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_228,local_1f0,"m1->hasUnlinkedUnits()","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x274,pcVar6);
    testing::internal::AssertHelper::operator=(local_208,local_200);
    testing::internal::AssertHelper::~AssertHelper(local_208);
    std::__cxx11::string::~string((string *)local_228);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_110);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_a0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Units, linkingToUnitsInAnotherModelReturnsUnlinked)
{
    auto m1 = libcellml::Model::create("m1");
    auto m2 = libcellml::Model::create("m2");
    auto c1 = libcellml::Component::create("c1");
    auto u1 = libcellml::Units::create("u1");
    auto v1 = libcellml::Variable::create("v1");
    auto v2 = libcellml::Variable::create("v2");

    c1->addVariable(v1);
    c1->addVariable(v2);
    m1->addComponent(c1);
    v1->setUnits(u1);
    v2->setUnits("second");

    m2->addUnits(u1); // Units assigned to v1 exist in a different model.

    EXPECT_FALSE(m1->linkUnits());
    EXPECT_TRUE(m1->hasUnlinkedUnits());
}